

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,OrderedScreen *s)

{
  QString *t;
  QDebug *pQVar1;
  undefined8 *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QDebug *in_stack_ffffffffffffff80;
  QDebug *in_stack_ffffffffffffff88;
  QDebug *this;
  QDebug *t_00;
  QDebug local_20;
  QDebug local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  t_00 = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff88,(char *)t_00);
  QDebug::operator<<((QDebug *)in_RDI,
                     (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  t = (QString *)QDebug::operator<<(in_stack_ffffffffffffff88,(char *)t_00);
  (**(code **)(*(long *)*in_RDX + 0x90))();
  QDebug::operator<<(in_stack_ffffffffffffff80,t);
  QDebug::operator<<(in_stack_ffffffffffffff88,(char *)t_00);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff6c);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff88,(char *)t_00);
  this = &local_20;
  QDebug::QDebug(this,pQVar1);
  pQVar1 = &local_18;
  operator<<((QDebug *)pQVar1,(QPoint *)this);
  QDebug::operator<<(this,(char *)t_00);
  QDebug::operator<<((QDebug *)in_RDI,SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
  QDebug::operator<<(this,(char *)t_00);
  QDebug::~QDebug(pQVar1);
  QDebug::~QDebug(this);
  QString::~QString((QString *)0x115edd);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const OrderedScreen &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "OrderedScreen(QPlatformScreen=" << s.screen << " (" << s.screen->name() << ") : "
                  << s.vinfo.virtualIndex
                  << " / " << s.vinfo.virtualPos
                  << " / primary: " << s.vinfo.isPrimary
                  << ")";
    return dbg;
}